

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reap.c
# Opt level: O1

_Bool nni_reap_sys_drain(void)

{
  byte bVar1;
  
  nni_mtx_lock(&reap_mtx);
  bVar1 = reap_empty;
  if (reap_empty == 0) {
    do {
      nni_cv_wait(&reap_empty_cv);
    } while (reap_empty != 1);
  }
  nni_mtx_unlock(&reap_mtx);
  return (_Bool)(bVar1 ^ 1);
}

Assistant:

bool
nni_reap_sys_drain(void)
{
	bool result = false;
	nni_mtx_lock(&reap_mtx);
	while (!reap_empty) {
		result = true;
		nni_cv_wait(&reap_empty_cv);
	}
	nni_mtx_unlock(&reap_mtx);
	return (result);
}